

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

cmDynamicLoaderCache * cmDynamicLoaderCache::GetInstance(void)

{
  _Rb_tree_header *p_Var1;
  
  if (Instance != (cmDynamicLoaderCache *)0x0) {
    return Instance;
  }
  Instance = (cmDynamicLoaderCache *)operator_new(0x30);
  (Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header;
  (Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (Instance->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return Instance;
}

Assistant:

cmDynamicLoaderCache* cmDynamicLoaderCache::GetInstance()
{
  if ( !cmDynamicLoaderCache::Instance )
    {
    cmDynamicLoaderCache::Instance = new cmDynamicLoaderCache;
    }
  return cmDynamicLoaderCache::Instance;
}